

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void bluntify(void)

{
  Node *this;
  Node *pNVar1;
  bool bVar2;
  iterator iVar3;
  char *pcVar4;
  Edges *pEVar5;
  long lVar6;
  iterator iVar7;
  iterator iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  Node *this_00;
  EdgesIterator EVar12;
  long expanded_node_id;
  long right_neighbour_id;
  Edges left_edges;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  good_edges;
  Edges right_edges;
  key_type local_108;
  Edges *local_100;
  long in_stack_ffffffffffffff08;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffff1c;
  EdgesIterator local_e0;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_d0;
  Edges *local_c8;
  Edges local_c0;
  pair<long,_long> local_a8;
  long local_98;
  Edges *local_90;
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  local_88;
  EdgesIterator local_58;
  Edges local_48;
  
  Logger::debug(logger,"bluntifying graph");
  local_88._M_impl._0_8_ = 1;
  if (0 < Node::last_id) {
    do {
      iVar3 = std::
              _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&Node::nodes._M_h,(key_type *)&local_88);
      if (iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>._M_cur !=
          (__node_type *)0x0) {
        iVar3 = std::
                _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&Node::nodes._M_h,(key_type *)&local_88);
        bVar2 = Edges::empty((Edges *)((long)iVar3.
                                             super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                             ._M_cur + 0x20));
        iVar11 = 0;
        if (!bVar2) {
          iVar11 = (k - (k + -1 >> 0x1f)) + -1 >> 1;
        }
        bVar2 = Edges::empty((Edges *)((long)iVar3.
                                             super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                             ._M_cur + 0x38));
        iVar10 = *(int *)((long)iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>.
                                _M_cur + 0x18);
        if (!bVar2) {
          iVar10 = iVar10 - k / 2;
        }
        pcVar4 = Node::get_sequence((Node *)((long)iVar3.
                                                  super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                                  ._M_cur + 0x10));
        Node::set_sequence((Node *)((long)iVar3.
                                          super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                          ._M_cur + 0x10),pcVar4 + iVar11,iVar10 - iVar11);
      }
      lVar6 = local_88._M_impl._0_8_ + 1;
      bVar2 = (long)local_88._M_impl._0_8_ < Node::last_id;
      local_88._M_impl._0_8_ = lVar6;
    } while (bVar2);
  }
  if ((k & 1U) == 0) {
    local_88._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88._M_impl.super__Rb_tree_header._M_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_108 = 1;
    local_98 = Node::last_id;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < Node::last_id) {
      do {
        iVar3 = std::
                _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&Node::nodes._M_h,&local_108);
        if (iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>._M_cur !=
            (__node_type *)0x0) {
          iVar3 = std::
                  _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&Node::nodes._M_h,&local_108);
          local_c8 = (Edges *)((long)iVar3.
                                     super__Node_iterator_base<std::pair<const_long,_Node>,_false>.
                                     _M_cur + 0x38);
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_48.neighbour_ids,(vector<long,_std::allocator<long>_> *)local_c8);
          EVar12 = Edges::begin(&local_48);
          local_c0.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)EVar12.edges;
          local_c0.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = EVar12.index;
          EVar12 = Edges::end(&local_48);
          pEVar5 = EVar12.edges;
          this = (Node *)((long)iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>.
                                _M_cur + 0x10);
          iVar11 = EVar12.index;
          lVar6 = 0;
          local_d0 = iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>._M_cur;
          while (bVar2 = Edges::EdgesIterator::operator!=
                                   ((EdgesIterator *)&local_c0,
                                    (EdgesIterator *)&stack0xffffffffffffff10), bVar2) {
            local_e0.edges = (Edges *)Edges::EdgesIterator::operator*((EdgesIterator *)&local_c0);
            if (0 < (long)local_e0.edges) {
              if (lVar6 == 0) {
                Node::get_sequence(this);
                lVar6 = Node::add_node((char *)CONCAT44(in_stack_ffffffffffffff1c,iVar11),0,
                                       (long)pEVar5,in_stack_ffffffffffffff08);
                Node::add_edge(this->id,'+',lVar6,'+');
              }
              Edges::erase(local_c8,(long)local_e0.edges);
              iVar7 = std::
                      _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&Node::nodes._M_h,(key_type *)&local_e0);
              Edges::erase((Edges *)((long)iVar7.
                                           super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                           ._M_cur + 0x38),this->id);
              Node::add_edge(lVar6,'+',(long)local_e0.edges,'-');
            }
            Edges::EdgesIterator::operator++((EdgesIterator *)&local_c0);
          }
          local_90 = (Edges *)((long)iVar3.
                                     super__Node_iterator_base<std::pair<const_long,_Node>,_false>.
                                     _M_cur + 0x20);
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_c0.neighbour_ids,(vector<long,_std::allocator<long>_> *)local_90);
          EVar12 = Edges::begin(&local_c0);
          pEVar5 = EVar12.edges;
          iVar11 = EVar12.index;
          EVar12 = Edges::end(&local_c0);
          local_e0.edges = EVar12.edges;
          local_e0.index = EVar12.index;
          while (bVar2 = Edges::EdgesIterator::operator!=
                                   ((EdgesIterator *)&stack0xffffffffffffff10,&local_e0), bVar2) {
            lVar6 = Edges::EdgesIterator::operator*((EdgesIterator *)&stack0xffffffffffffff10);
            if (lVar6 < 0) {
              in_stack_ffffffffffffff08 = this->id;
              local_100 = (Edges *)-lVar6;
              iVar8 = std::
                      _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                      ::find(&local_88,(key_type *)&local_100);
              if ((_Rb_tree_header *)iVar8._M_node == &local_88._M_impl.super__Rb_tree_header) {
                local_100 = (Edges *)-lVar6;
                iVar3 = std::
                        _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(&Node::nodes._M_h,(key_type *)&local_100);
                Edges::erase(local_90,lVar6);
                Edges::erase((Edges *)((long)iVar3.
                                             super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                             ._M_cur + 0x20),-this->id);
                lVar9 = 1;
                lVar6 = 1;
                if (*(int *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_long,_Node>,_false>.
                                   _M_cur + 0x18) < 2) {
                  lVar6 = Edges::size((Edges *)((long)iVar3.
                                                  super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                                  ._M_cur + 0x38));
                }
                if (*(int *)((long)&((local_d0._M_cur)->
                                    super__Hash_node_value<std::pair<const_long,_Node>,_false>).
                                    super__Hash_node_value_base<std::pair<const_long,_Node>_>.
                                    _M_storage._M_storage + 0x10) < 2) {
                  lVar9 = Edges::size(local_c8);
                }
                if ((lVar6 != 0) && (lVar9 != 0)) {
                  this_00 = (Node *)((long)iVar3.
                                           super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                           ._M_cur + 0x10);
                  pNVar1 = this;
                  if (lVar9 <= lVar6) {
                    this_00 = this;
                    pNVar1 = (Node *)((long)iVar3.
                                            super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                            ._M_cur + 0x10);
                  }
                  if (1 < this_00->sequence_len) {
                    Node::get_sequence(this_00);
                    local_100 = (Edges *)Node::add_node((char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                                         iVar11),0,(long)pEVar5,
                                                        in_stack_ffffffffffffff08);
                    this_00->sequence_len = 1;
                    iVar3 = std::
                            _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(&Node::nodes._M_h,(key_type *)&local_100);
                    Node::move_right_edges_to
                              (this_00,(Node *)((long)iVar3.
                                                  super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                                  ._M_cur + 0x10),true);
                    Node::add_edge(this_00->id,'+',(long)local_100,'+');
                  }
                  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
                  EVar12 = Edges::begin(&this_00->right_edges);
                  local_100 = EVar12.edges;
                  in_stack_ffffffffffffff08 = CONCAT44(uVar13,EVar12.index);
                  EVar12 = Edges::end(&this_00->right_edges);
                  local_58.edges = EVar12.edges;
                  local_58.index = EVar12.index;
                  while (bVar2 = Edges::EdgesIterator::operator!=
                                           ((EdgesIterator *)&local_100,&local_58), bVar2) {
                    lVar6 = Edges::EdgesIterator::operator*((EdgesIterator *)&local_100);
                    if (lVar6 < 0) {
                      lVar6 = -lVar6;
                      Node::add_edge(lVar6,'-',pNVar1->id,'+');
                      local_a8.second = pNVar1->id;
                      local_a8.first = lVar6;
                      std::
                      _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                      ::_M_emplace_unique<std::pair<long,long>>
                                ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                                  *)&local_88,&local_a8);
                      local_a8.first = pNVar1->id;
                      local_a8.second = lVar6;
                      std::
                      _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                      ::_M_emplace_unique<std::pair<long,long>>
                                ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                                  *)&local_88,&local_a8);
                    }
                    else {
                      Node::add_edge(lVar6,'+',pNVar1->id,'+');
                    }
                    Edges::EdgesIterator::operator++((EdgesIterator *)&local_100);
                  }
                }
              }
            }
            Edges::EdgesIterator::operator++((EdgesIterator *)&stack0xffffffffffffff10);
          }
          if ((Edges *)local_c0.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start != (Edges *)0x0) {
            operator_delete(local_c0.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_48.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        lVar6 = local_108 + 1;
        bVar2 = local_108 < local_98;
        local_108 = lVar6;
      } while (bVar2);
    }
    std::
    _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
    ::~_Rb_tree(&local_88);
  }
  return;
}

Assistant:

void bluntify() {
    logger->debug("bluntifying graph");
    for (long i = 1; i <= Node::last_id; ++i) {
        if (Node::nodes.find(i) == Node::nodes.end())
            continue;
        Node &node = Node::nodes.find(i)->second;
        int from, to;
        if (!node.left_edges.empty())
            from = (k - 1) / 2;
        else
            from = 0;
        if (!node.right_edges.empty())
            to = node.sequence_len - k / 2;
        else
            to = node.sequence_len;
        node.set_sequence(node.get_sequence() + from, to - from);
    }
    if (k % 2 == 0) {
        set<pair<long, long>> good_edges;
        long node_last_id = Node::last_id;
        for (long i = 1; i <= node_last_id; ++i) {
            if (Node::nodes.find(i) == Node::nodes.end())
                continue;
            Node &node = Node::nodes.find(i)->second;
            long new_right_node_id = 0;
            auto right_edges = node.right_edges;
            for (long right_neighbour_id : right_edges) {
                if (right_neighbour_id > 0) {
                    if (new_right_node_id == 0) {
                        new_right_node_id = Node::add_node(node.get_sequence() + node.sequence_len, 1);
                        Node::add_edge(node.id, '+', new_right_node_id, '+');
                    }
                    node.right_edges.erase(right_neighbour_id);
                    Node::nodes.find(right_neighbour_id)->second.right_edges.erase(node.id);
                    Node::add_edge(new_right_node_id, '+', right_neighbour_id, '-');
                }
            }
            auto left_edges = node.left_edges;
            for (long left_neighbour_id : left_edges)
                if (left_neighbour_id < 0 &&
                    good_edges.find(pair<long, long>(-1 * left_neighbour_id, node.id)) == good_edges.end()) {
                    Node &left_neighbour = Node::nodes.find(-1 * left_neighbour_id)->second;
                    node.left_edges.erase(left_neighbour_id);
                    left_neighbour.left_edges.erase(node.id * -1);
                    long left_neighbour_right_edge_size =
                            left_neighbour.sequence_len > 1 ? 1 : left_neighbour.right_edges.size();
                    long node_right_edge_size = node.sequence_len > 1 ? 1 : node.right_edges.size();
                    if (left_neighbour_right_edge_size == 0 || node_right_edge_size == 0)
                        continue;
                    Node *from_node, *to_node;
                    if (left_neighbour_right_edge_size < node_right_edge_size) {
                        from_node = &left_neighbour;
                        to_node = &node;
                    } else {
                        from_node = &node;
                        to_node = &left_neighbour;
                    }
                    if (from_node->sequence_len > 1) {
                        long expanded_node_id = Node::add_node(from_node->get_sequence() + 1,
                                                               from_node->sequence_len - 1);
                        from_node->sequence_len = 1;
                        from_node->move_right_edges_to(Node::nodes.find(expanded_node_id)->second);
                        Node::add_edge(from_node->id, '+', expanded_node_id, '+');
                    }
                    for (long right_neighbour_id : from_node->right_edges)
                        if (right_neighbour_id < 0) {
                            Node::add_edge(-1 * right_neighbour_id, '-', to_node->id, '+');
                            good_edges.emplace(pair<long, long>(-1 * right_neighbour_id, to_node->id));
                            good_edges.emplace(pair<long, long>(to_node->id, -1 * right_neighbour_id));
                        } else
                            Node::add_edge(right_neighbour_id, '+', to_node->id, '+');
                }
        }
    }
}